

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

uint32_t lzma_check_size(lzma_check type)

{
  uint local_c;
  lzma_check type_local;
  
  if (type < 0x10) {
    local_c = (uint)""[type];
  }
  else {
    local_c = 0xffffffff;
  }
  return local_c;
}

Assistant:

extern LZMA_API(uint32_t)
lzma_check_size(lzma_check type)
{
	// See file-format.txt section 2.1.1.2.
	static const uint8_t check_sizes[LZMA_CHECK_ID_MAX + 1] = {
		0,
		4, 4, 4,
		8, 8, 8,
		16, 16, 16,
		32, 32, 32,
		64, 64, 64
	};

	if ((unsigned int)(type) > LZMA_CHECK_ID_MAX)
		return UINT32_MAX;

	return check_sizes[(unsigned int)(type)];
}